

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RewardModelTOISparse.cpp
# Opt level: O0

void __thiscall
RewardModelTOISparse::Set
          (RewardModelTOISparse *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *sIs,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *aIs,double reward)

{
  pair<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_double>
  *__x;
  _Rb_tree_iterator<std::pair<const_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_double>_>
  this_00;
  long in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<pair<vector<unsigned_int>,_vector<unsigned_int>_>,_double>_>::value,_pair<iterator,_bool>_>
  _Var1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff40;
  map<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_double,_std::less<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_double>_>_>
  *this_01;
  map<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_double,_std::less<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_double>_>_>
  local_88 [2];
  
  __x = (pair<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_double>
         *)(in_RDI + 0x40);
  this_01 = local_88;
  std::
  make_pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const&,std::vector<unsigned_int,std::allocator<unsigned_int>>const&>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__x,in_stack_ffffffffffffff40);
  std::
  make_pair<std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>>,double&>
            (&__x->first,(double *)in_stack_ffffffffffffff40);
  _Var1 = std::
          map<std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>>,double,std::less<std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>>>,std::allocator<std::pair<std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>>const,double>>>
          ::
          insert<std::pair<std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>>,double>>
                    (this_01,__x);
  this_00 = _Var1.first._M_node;
  std::
  pair<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_double>
  ::~pair((pair<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_double>
           *)0xaa00b7);
  std::
  pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  ::~pair((pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
           *)this_00._M_node);
  return;
}

Assistant:

void RewardModelTOISparse::Set(const std::vector<Index> &sIs,
                               const std::vector<Index> &aIs,
                               double reward)
{
    _m_R.insert(make_pair(make_pair(sIs,aIs),reward));
}